

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

void __thiscall jrtplib::RTCPScheduler::PerformReverseReconsideration(RTCPScheduler *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  RTPTime local_60;
  RTPTime local_58;
  RTPTime local_50;
  RTPTime local_48;
  RTPTime tc_min_tp;
  RTPTime local_38;
  RTPTime tn_min_tc;
  RTPTime tc;
  int members;
  double diff2;
  double diff1;
  RTCPScheduler *this_local;
  
  if ((this->firstcall & 1U) == 0) {
    iVar4 = RTPSources::GetActiveMemberCount(this->sources);
    tn_min_tc = RTPTime::CurrentTime();
    local_38.m_t = (this->nextrtcptime).m_t;
    bVar3 = RTPTime::operator>(&local_38,&tn_min_tc);
    if (bVar3) {
      RTPTime::operator-=(&local_38,&tn_min_tc);
    }
    else {
      RTPTime::RTPTime(&tc_min_tp,0,0);
      local_38.m_t = tc_min_tp.m_t;
    }
    local_48.m_t = tn_min_tc.m_t;
    bVar3 = RTPTime::operator>(&local_48,&this->prevrtcptime);
    if (bVar3) {
      RTPTime::operator-=(&local_48,&this->prevrtcptime);
    }
    else {
      RTPTime::RTPTime(&local_50,0.0);
      local_48.m_t = local_50.m_t;
    }
    if (this->pmembers == 0) {
      this->pmembers = this->pmembers + 1;
    }
    iVar1 = this->pmembers;
    dVar5 = RTPTime::GetDouble(&local_38);
    iVar2 = this->pmembers;
    dVar6 = RTPTime::GetDouble(&local_48);
    (this->nextrtcptime).m_t = tn_min_tc.m_t;
    (this->prevrtcptime).m_t = tn_min_tc.m_t;
    RTPTime::RTPTime(&local_58,((double)iVar4 / (double)iVar1) * dVar5);
    RTPTime::operator+=(&this->nextrtcptime,&local_58);
    RTPTime::RTPTime(&local_60,((double)iVar4 / (double)iVar2) * dVar6);
    RTPTime::operator-=(&this->prevrtcptime,&local_60);
    this->pmembers = iVar4;
  }
  return;
}

Assistant:

void RTCPScheduler::PerformReverseReconsideration()
{
	if (firstcall)
		return;
	
	double diff1,diff2;
	int members = sources.GetActiveMemberCount();
	
	RTPTime tc = RTPTime::CurrentTime();
	RTPTime tn_min_tc = nextrtcptime;

	if (tn_min_tc > tc)
		tn_min_tc -= tc;
	else
		tn_min_tc = RTPTime(0,0);

//	std::cout << "+tn_min_tc0 " << nextrtcptime.GetDouble()-tc.GetDouble() << std::endl;
//	std::cout << "-tn_min_tc0 " << -nextrtcptime.GetDouble()+tc.GetDouble() << std::endl;
//	std::cout << "tn_min_tc " << tn_min_tc.GetDouble() << std::endl;
	
	RTPTime tc_min_tp = tc;

	if (tc_min_tp > prevrtcptime)
		tc_min_tp -= prevrtcptime;
	else
		tc_min_tp = 0;
	
	if (pmembers == 0) // avoid division by zero
		pmembers++;
	
	diff1 = (((double)members)/((double)pmembers))*tn_min_tc.GetDouble();
	diff2 = (((double)members)/((double)pmembers))*tc_min_tp.GetDouble();

	nextrtcptime = tc;
	prevrtcptime = tc;
	nextrtcptime += RTPTime(diff1);
	prevrtcptime -= RTPTime(diff2);
	
	pmembers = members;
}